

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btTransform *rbAFrame,bool useReferenceFrameA)

{
  btTransform *this_00;
  btVector3 *pbVar1;
  byte in_CL;
  undefined8 *in_RDI;
  btVector3 bVar2;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar3;
  btRigidBody *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [16];
  undefined8 *local_68;
  undefined8 *local_48;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._4_4_,
             in_stack_ffffffffffffff50);
  *in_RDI = &PTR__btHingeConstraint_002e72c0;
  local_48 = in_RDI + 9;
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff50);
    local_48 = (undefined8 *)((long)local_48 + 0x54);
  } while (local_48 != (undefined8 *)((long)in_RDI + 0x144));
  local_68 = (undefined8 *)((long)in_RDI + 0x144);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff50);
    local_68 = (undefined8 *)((long)local_68 + 0x54);
  } while (local_68 != in_RDI + 0x48);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff50,
             (btTransform *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff50,
             (btTransform *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  btAngularLimit::btAngularLimit((btAngularLimit *)(in_RDI + 0x59));
  *(undefined1 *)(in_RDI + 0x5f) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fa) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fb) = 1;
  *(byte *)((long)in_RDI + 0x2fc) = in_CL & 1;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  this_00 = btRigidBody::getCenterOfMassTransform((btRigidBody *)in_RDI[5]);
  pbVar1 = btTransform::getOrigin((btTransform *)(in_RDI + 0x48));
  bVar2 = btTransform::operator()(this_00,pbVar1);
  pbVar1 = btTransform::getOrigin((btTransform *)(in_RDI + 0x50));
  *(long *)pbVar1->m_floats = bVar2.m_floats._0_8_;
  *(long *)(pbVar1->m_floats + 2) = bVar2.m_floats._8_8_;
  uVar3 = 0xbf800000;
  if ((*(byte *)((long)in_RDI + 0x2fc) & 1) == 0) {
    uVar3 = 0x3f800000;
  }
  *(undefined4 *)((long)in_RDI + 0x2f4) = uVar3;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA, const btTransform& rbAFrame, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),m_rbAFrame(rbAFrame),m_rbBFrame(rbAFrame),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false),
m_enableAngularMotor(false),
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{
	///not providing rigidbody B means implicitly using worldspace for body B

	m_rbBFrame.getOrigin() = m_rbA.getCenterOfMassTransform()(m_rbAFrame.getOrigin());
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}